

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

void __thiscall soul::heart::Printer::PrinterStream::printBlock(PrinterStream *this,Block *b)

{
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  CodePrinter *pCVar4;
  Object *s_00;
  ArrayView<soul::pool_ref<soul::heart::Variable>_> parameters;
  size_t sVar5;
  Block *in_RDX;
  Statement *s;
  Statement *s_01;
  string_view text;
  string_view text_00;
  char s_1 [2];
  Indent statementIndent;
  Indent labelIndent;
  char local_7a [2];
  string local_78;
  Block *local_58;
  Indent local_50;
  Indent local_40;
  
  pCVar4 = this->out;
  local_40.amount = 2;
  local_40.openBrace = '\0';
  local_40.closeBrace = '\0';
  iVar3 = pCVar4->indent;
  pCVar4->indent = iVar3 + 2;
  local_40.owner = pCVar4;
  if (iVar3 < -2) {
    throwInternalCompilerError("indent >= 0","addIndent",0xc2);
  }
  getBlockName_abi_cxx11_(&local_78,(PrinterStream *)b,in_RDX);
  text._M_str = local_78._M_dataplus._M_p;
  text._M_len = local_78._M_string_length;
  local_58 = b;
  choc::text::CodePrinter::writeBlock(pCVar4,text);
  paVar2 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT62(local_78.field_2._M_allocated_capacity._2_6_,
                             local_78.field_2._M_allocated_capacity._0_2_) + 1);
  }
  pvVar1 = &local_58->parameters;
  parameters.s = (pvVar1->
                 super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  parameters.e = (pvVar1->
                 super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
  if ((pvVar1->
      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (local_58->parameters).
      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    printParameters(this,parameters);
  }
  pCVar4 = this->out;
  text_00._M_str = ":";
  text_00._M_len = 1;
  choc::text::CodePrinter::writeBlock(pCVar4,text_00);
  local_78.field_2._M_allocated_capacity._0_2_ = 10;
  local_78._M_string_length = 1;
  local_78._M_dataplus._M_p = (pointer)paVar2;
  choc::text::CodePrinter::append(pCVar4,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT62(local_78.field_2._M_allocated_capacity._2_6_,
                             local_78.field_2._M_allocated_capacity._0_2_) + 1);
  }
  local_50.owner = this->out;
  local_50.amount = 2;
  local_50.openBrace = '\0';
  local_50.closeBrace = '\0';
  iVar3 = (local_50.owner)->indent;
  (local_50.owner)->indent = iVar3 + 2;
  if (-3 < iVar3) {
    s_01 = (local_58->statements).firstObject;
    if (s_01 != (Statement *)0x0) {
      do {
        printStatementDescription(this,&s_01->super_Object);
        pCVar4 = this->out;
        local_7a[0] = ';';
        local_7a[1] = '\0';
        local_78._M_dataplus._M_p = (pointer)paVar2;
        sVar5 = strlen(local_7a);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,local_7a,local_7a + sVar5);
        choc::text::CodePrinter::append(pCVar4,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar2) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT62(local_78.field_2._M_allocated_capacity._2_6_,
                                   local_78.field_2._M_allocated_capacity._0_2_) + 1);
        }
        local_78.field_2._M_allocated_capacity._0_2_ = 10;
        local_78._M_string_length = 1;
        local_78._M_dataplus._M_p = (pointer)paVar2;
        choc::text::CodePrinter::append(pCVar4,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar2) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT62(local_78.field_2._M_allocated_capacity._2_6_,
                                   local_78.field_2._M_allocated_capacity._0_2_) + 1);
        }
        s_01 = s_01->nextObject;
      } while (s_01 != (Statement *)0x0);
    }
    s_00 = &((local_58->terminator).object)->super_Object;
    if (s_00 != (Object *)0x0) {
      printStatementDescription(this,s_00);
      pCVar4 = this->out;
      local_7a[0] = ';';
      local_7a[1] = '\0';
      local_78._M_dataplus._M_p = (pointer)paVar2;
      sVar5 = strlen(local_7a);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,local_7a,local_7a + sVar5)
      ;
      choc::text::CodePrinter::append(pCVar4,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT62(local_78.field_2._M_allocated_capacity._2_6_,
                                 local_78.field_2._M_allocated_capacity._0_2_) + 1);
      }
      local_78.field_2._M_allocated_capacity._0_2_ = 10;
      local_78._M_string_length = 1;
      local_78._M_dataplus._M_p = (pointer)paVar2;
      choc::text::CodePrinter::append(pCVar4,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT62(local_78.field_2._M_allocated_capacity._2_6_,
                                 local_78.field_2._M_allocated_capacity._0_2_) + 1);
      }
      choc::text::CodePrinter::Indent::~Indent(&local_50);
      choc::text::CodePrinter::Indent::~Indent(&local_40);
      return;
    }
    throwInternalCompilerError("object != nullptr","operator*",0x3b);
  }
  throwInternalCompilerError("indent >= 0","addIndent",0xc2);
}

Assistant:

void printBlock (heart::Block& b)
        {
            auto labelIndent = out.createIndent (2);
            out << getBlockName (b);

            if (!b.parameters.empty())
                printParameters (b.parameters);

            out << ":" << newLine;

            auto statementIndent = out.createIndent (2);

            for (auto s : b.statements)
            {
                printStatementDescription (*s);
                out << ';' << newLine;
            }

            printStatementDescription (*b.terminator);
            out << ';' << newLine;
        }